

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_traits.h
# Opt level: O0

void lzham::helpers::construct_array<lzham::lzcompressor::lzdecision>(lzdecision *p,uint n)

{
  uint in_ESI;
  lzdecision *in_RDI;
  lzdecision *q;
  lzdecision *local_8;
  
  for (local_8 = in_RDI; local_8 != in_RDI + in_ESI; local_8 = local_8 + 1) {
    lzcompressor::lzdecision::lzdecision(local_8);
  }
  return;
}

Assistant:

inline void construct_array(T* p, uint n)
      {
         if (LZHAM_IS_SCALAR_TYPE(T))
         {
            memset(p, 0, sizeof(T) * n);
         }
         else
         {
            T* q = p + n;
            for ( ; p != q; ++p)
               new (static_cast<void*>(p)) T;
         }
      }